

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O0

int compute_num_mod_workers(AV1_COMP *cpi,MULTI_THREADED_MODULES mod_name)

{
  AV1_COMP *cpi_00;
  uint in_ESI;
  AV1_COMP *in_RDI;
  int num_mod_workers;
  int local_10;
  
  local_10 = 0;
  cpi_00 = (AV1_COMP *)(ulong)in_ESI;
  switch(cpi_00) {
  case (AV1_COMP *)0x0:
    if ((in_RDI->oxcf).pass < AOM_RC_LAST_PASS) {
      local_10 = compute_num_enc_workers(cpi_00,0);
    }
    else {
      local_10 = 0;
    }
    break;
  case (AV1_COMP *)0x1:
    local_10 = compute_num_tf_workers(in_RDI);
    break;
  case (AV1_COMP *)0x2:
    local_10 = compute_num_tpl_workers((AV1_COMP *)0x25684e);
    break;
  case (AV1_COMP *)0x3:
    local_10 = 1;
    break;
  case (AV1_COMP *)0x4:
    local_10 = compute_num_enc_workers(cpi_00,0);
    break;
  case (AV1_COMP *)0x5:
    local_10 = compute_num_lf_workers((AV1_COMP *)0x25688c);
    break;
  case (AV1_COMP *)0x6:
    local_10 = compute_num_cdef_workers((AV1_COMP *)0x25689c);
    break;
  case (AV1_COMP *)0x7:
    local_10 = compute_num_cdef_workers((AV1_COMP *)0x2568ac);
    break;
  case (AV1_COMP *)0x8:
    local_10 = compute_num_lr_workers((AV1_COMP *)0x2568bc);
    break;
  case (AV1_COMP *)0x9:
    local_10 = compute_num_pack_bs_workers(cpi_00);
    break;
  case (AV1_COMP *)0xa:
    local_10 = (in_RDI->ppi->p_mt_info).num_mod_workers[10];
    break;
  case (AV1_COMP *)0xb:
    if ((in_RDI->oxcf).pass == AOM_RC_ONE_PASS) {
      local_10 = compute_num_ai_workers(in_RDI);
    }
    else {
      local_10 = 0;
    }
  }
  return local_10;
}

Assistant:

static int compute_num_mod_workers(AV1_COMP *cpi,
                                   MULTI_THREADED_MODULES mod_name) {
  int num_mod_workers = 0;
  switch (mod_name) {
    case MOD_FP:
      if (cpi->oxcf.pass >= AOM_RC_SECOND_PASS)
        num_mod_workers = 0;
      else
        num_mod_workers = compute_num_enc_workers(cpi, cpi->oxcf.max_threads);
      break;
    case MOD_TF: num_mod_workers = compute_num_tf_workers(cpi); break;
    case MOD_TPL: num_mod_workers = compute_num_tpl_workers(cpi); break;
    case MOD_GME: num_mod_workers = 1; break;
    case MOD_ENC:
      num_mod_workers = compute_num_enc_workers(cpi, cpi->oxcf.max_threads);
      break;
    case MOD_LPF: num_mod_workers = compute_num_lf_workers(cpi); break;
    case MOD_CDEF_SEARCH:
      num_mod_workers = compute_num_cdef_workers(cpi);
      break;
    case MOD_CDEF: num_mod_workers = compute_num_cdef_workers(cpi); break;
    case MOD_LR: num_mod_workers = compute_num_lr_workers(cpi); break;
    case MOD_PACK_BS: num_mod_workers = compute_num_pack_bs_workers(cpi); break;
    case MOD_FRAME_ENC:
      num_mod_workers = cpi->ppi->p_mt_info.num_mod_workers[MOD_FRAME_ENC];
      break;
    case MOD_AI:
      if (cpi->oxcf.pass == AOM_RC_ONE_PASS) {
        num_mod_workers = compute_num_ai_workers(cpi);
      } else {
        num_mod_workers = 0;
      }
      break;
    default: assert(0); break;
  }
  return (num_mod_workers);
}